

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O3

UChar32 anon_unknown.dwarf_2cfbd6::getRange
                  (void *t,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  char cVar1;
  char cVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t uVar12;
  int iVar13;
  long lVar14;
  ulong in_R11;
  uint uVar15;
  int iVar16;
  bool bVar17;
  UChar32 UVar18;
  uint local_78;
  long local_58;
  
  UVar18 = -1;
  if ((uint)start < 0x110000) {
    cVar1 = *(char *)((long)t + 0x1f);
    if (start < *(int *)((long)t + 0x18)) {
      uVar6 = *(uint32_t *)((long)t + 0x2c);
      if (filter != (UCPMapValueFilter *)0x0) {
        uVar6 = (*filter)(context,uVar6);
      }
      lVar4 = *t;
      uVar7 = 0xffffffff;
      bVar17 = false;
      local_78 = 0xffffffff;
      uVar15 = start;
      do {
        cVar2 = *(char *)((long)t + 0x1e);
        if (((int)uVar15 < 0x10000) && ((int)uVar15 < 0x1000 || cVar2 == '\0')) {
          uVar9 = (int)uVar15 >> 6;
          local_58 = 0x40;
          if (cVar2 == '\0') {
            local_58 = 0x400;
          }
          iVar13 = 0x40;
          uVar11 = 0;
LAB_002c59bb:
          lVar14 = (long)(int)uVar9;
          do {
            if (uVar11 < 0x8000) {
              uVar9 = (uint)*(ushort *)(lVar4 + (ulong)uVar11 * 2 + lVar14 * 2);
            }
            else {
              uVar9 = (uint)lVar14;
              iVar16 = ((int)uVar9 >> 3) + (uVar9 & 0xfffffff8) + (uVar11 & 0x7fff);
              uVar9 = (uint)*(ushort *)(lVar4 + (long)(int)((uVar9 & 7) + iVar16 + 1) * 2) |
                      (uint)*(ushort *)(lVar4 + (long)iVar16 * 2) << (char)(uVar9 & 7) * '\x02' + 2
                      & 0x30000;
            }
            if ((uVar9 == uVar7) && (iVar13 <= (int)(uVar15 - start))) {
              uVar15 = uVar15 + iVar13;
            }
            else {
              uVar7 = uVar9;
              if (uVar9 == *(uint *)((long)t + 0x28)) {
                if (bVar17) {
                  if (uVar6 != (uint)in_R11) goto LAB_002c5cdc;
                }
                else {
                  bVar17 = true;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar6;
                  }
                }
                uVar15 = uVar15 + iVar13 & -iVar13;
                in_R11 = (ulong)uVar6;
              }
              else {
                lVar5 = *(long *)((long)t + 8);
                uVar10 = (ulong)((uVar15 & iVar13 - 1U) + uVar9);
                if (cVar1 == '\x02') {
                  uVar12 = (uint32_t)*(byte *)(lVar5 + uVar10);
                }
                else if (cVar1 == '\x01') {
                  uVar12 = *(uint32_t *)(lVar5 + uVar10 * 4);
                }
                else {
                  uVar12 = 0xffffffff;
                  if (cVar1 == '\0') {
                    uVar12 = (uint32_t)*(ushort *)(lVar5 + uVar10 * 2);
                  }
                }
                uVar9 = uVar12;
                if (uVar12 == *(uint32_t *)((long)t + 0x2c)) {
                  uVar9 = uVar6;
                }
                if ((filter != (UCPMapValueFilter *)0x0) &&
                   (uVar12 != *(uint32_t *)((long)t + 0x2c))) {
                  in_R11 = in_R11 & 0xffffffff;
                  uVar9 = (*filter)(context,uVar12);
                }
                if (bVar17) {
                  if (uVar9 != (uint)in_R11) goto LAB_002c5cdc;
                }
                else {
                  bVar17 = true;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar9;
                  }
                  in_R11 = (ulong)uVar9;
                }
                iVar16 = uVar15 - 1;
                while( true ) {
                  uVar10 = uVar10 + 1;
                  uVar15 = iVar16 + 2;
                  if ((iVar13 - 1U & uVar15) == 0) break;
                  lVar5 = *(long *)((long)t + 8);
                  if (cVar1 == '\x02') {
                    uVar12 = (uint32_t)*(byte *)(lVar5 + uVar10);
                  }
                  else if (cVar1 == '\x01') {
                    uVar12 = *(uint32_t *)(lVar5 + uVar10 * 4);
                  }
                  else {
                    uVar12 = 0xffffffff;
                    if (cVar1 == '\0') {
                      uVar12 = (uint32_t)*(ushort *)(lVar5 + uVar10 * 2);
                    }
                  }
                  uVar8 = uVar12;
                  if (uVar12 == *(uint32_t *)((long)t + 0x2c)) {
                    uVar8 = uVar6;
                  }
                  if ((filter != (UCPMapValueFilter *)0x0) &&
                     (uVar12 != *(uint32_t *)((long)t + 0x2c))) {
                    in_R11 = in_R11 & 0xffffffff;
                    uVar8 = (*filter)(context,uVar12);
                  }
                  iVar16 = iVar16 + 1;
                  if (uVar8 != (uint32_t)in_R11) {
                    return iVar16;
                  }
                }
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_58);
        }
        else {
          uVar11 = (uVar15 >> 0xe) + 0x3fc;
          if (cVar2 != '\0') {
            uVar11 = (uVar15 >> 0xe) + 0x40;
          }
          uVar3 = *(ushort *)
                   (*t + (ulong)((uVar15 >> 9 & 0x1f) + (uint)*(ushort *)(*t + (ulong)uVar11 * 2)) *
                         2);
          uVar11 = (uint)uVar3;
          if ((local_78 == uVar3) && (0x1ff < (int)(uVar15 - start))) {
            uVar15 = uVar15 + 0x200;
          }
          else {
            if (uVar3 != *(ushort *)((long)t + 0x26)) {
              uVar9 = uVar15 >> 4 & 0x1f;
              iVar13 = 0x10;
              local_58 = 0x20;
              local_78 = (uint)uVar3;
              goto LAB_002c59bb;
            }
            if (bVar17) {
              if (uVar6 != (uint)in_R11) {
LAB_002c5cdc:
                return uVar15 - 1;
              }
            }
            else {
              bVar17 = true;
              if (pValue != (uint32_t *)0x0) {
                *pValue = uVar6;
              }
            }
            uVar7 = *(uint *)((long)t + 0x28);
            uVar15 = (uVar15 & 0xfffffe00) + 0x200;
            in_R11 = (ulong)uVar6;
            local_78 = uVar11;
          }
        }
      } while ((int)uVar15 < *(int *)((long)t + 0x18));
      lVar4 = (long)*(int *)((long)t + 0x14) + -2;
      lVar14 = *(long *)((long)t + 8);
      if (cVar1 == '\x02') {
        uVar12 = (uint32_t)*(byte *)(lVar14 + lVar4);
      }
      else if (cVar1 == '\x01') {
        uVar12 = *(uint32_t *)(lVar14 + (long)(int)lVar4 * 4);
      }
      else {
        uVar12 = 0xffffffff;
        if (cVar1 == '\0') {
          uVar12 = (uint32_t)*(ushort *)(lVar14 + -4 + (long)*(int *)((long)t + 0x14) * 2);
        }
      }
      if (uVar12 != *(uint32_t *)((long)t + 0x2c)) {
        uVar6 = uVar12;
      }
      if ((filter != (UCPMapValueFilter *)0x0) && (uVar12 != *(uint32_t *)((long)t + 0x2c))) {
        uVar6 = (*filter)(context,uVar12);
      }
      UVar18 = 0x10ffff;
      if (uVar6 != (uint32_t)in_R11) {
        UVar18 = uVar15 - 1;
      }
    }
    else {
      UVar18 = 0x10ffff;
      if (pValue != (uint32_t *)0x0) {
        lVar4 = (long)*(int *)((long)t + 0x14) + -2;
        lVar14 = *(long *)((long)t + 8);
        if (cVar1 == '\x02') {
          uVar6 = (uint32_t)*(byte *)(lVar14 + lVar4);
        }
        else if (cVar1 == '\x01') {
          uVar6 = *(uint32_t *)(lVar14 + (long)(int)lVar4 * 4);
        }
        else {
          uVar6 = 0xffffffff;
          if (cVar1 == '\0') {
            uVar6 = (uint32_t)*(ushort *)(lVar14 + -4 + (long)*(int *)((long)t + 0x14) * 2);
          }
        }
        if (filter != (UCPMapValueFilter *)0x0) {
          uVar6 = (*filter)(context,uVar6);
        }
        *pValue = uVar6;
      }
    }
  }
  return UVar18;
}

Assistant:

UChar32 getRange(const void *t, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    if ((uint32_t)start > MAX_UNICODE) {
        return U_SENTINEL;
    }
    const UCPTrie *trie = reinterpret_cast<const UCPTrie *>(t);
    UCPTrieValueWidth valueWidth = (UCPTrieValueWidth)trie->valueWidth;
    if (start >= trie->highStart) {
        if (pValue != nullptr) {
            int32_t di = trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET;
            uint32_t value = getValue(trie->data, valueWidth, di);
            if (filter != nullptr) { value = filter(context, value); }
            *pValue = value;
        }
        return MAX_UNICODE;
    }

    uint32_t nullValue = trie->nullValue;
    if (filter != nullptr) { nullValue = filter(context, nullValue); }
    const uint16_t *index = trie->index;

    int32_t prevI3Block = -1;
    int32_t prevBlock = -1;
    UChar32 c = start;
    uint32_t value;
    bool haveValue = false;
    do {
        int32_t i3Block;
        int32_t i3;
        int32_t i3BlockLength;
        int32_t dataBlockLength;
        if (c <= 0xffff && (trie->type == UCPTRIE_TYPE_FAST || c <= UCPTRIE_SMALL_MAX)) {
            i3Block = 0;
            i3 = c >> UCPTRIE_FAST_SHIFT;
            i3BlockLength = trie->type == UCPTRIE_TYPE_FAST ?
                UCPTRIE_BMP_INDEX_LENGTH : UCPTRIE_SMALL_INDEX_LENGTH;
            dataBlockLength = UCPTRIE_FAST_DATA_BLOCK_LENGTH;
        } else {
            // Use the multi-stage index.
            int32_t i1 = c >> UCPTRIE_SHIFT_1;
            if (trie->type == UCPTRIE_TYPE_FAST) {
                U_ASSERT(0xffff < c && c < trie->highStart);
                i1 += UCPTRIE_BMP_INDEX_LENGTH - UCPTRIE_OMITTED_BMP_INDEX_1_LENGTH;
            } else {
                U_ASSERT(c < trie->highStart && trie->highStart > UCPTRIE_SMALL_LIMIT);
                i1 += UCPTRIE_SMALL_INDEX_LENGTH;
            }
            i3Block = trie->index[
                (int32_t)trie->index[i1] + ((c >> UCPTRIE_SHIFT_2) & UCPTRIE_INDEX_2_MASK)];
            if (i3Block == prevI3Block && (c - start) >= UCPTRIE_CP_PER_INDEX_2_ENTRY) {
                // The index-3 block is the same as the previous one, and filled with value.
                U_ASSERT((c & (UCPTRIE_CP_PER_INDEX_2_ENTRY - 1)) == 0);
                c += UCPTRIE_CP_PER_INDEX_2_ENTRY;
                continue;
            }
            prevI3Block = i3Block;
            if (i3Block == trie->index3NullOffset) {
                // This is the index-3 null block.
                if (haveValue) {
                    if (nullValue != value) {
                        return c - 1;
                    }
                } else {
                    value = nullValue;
                    if (pValue != nullptr) { *pValue = nullValue; }
                    haveValue = true;
                }
                prevBlock = trie->dataNullOffset;
                c = (c + UCPTRIE_CP_PER_INDEX_2_ENTRY) & ~(UCPTRIE_CP_PER_INDEX_2_ENTRY - 1);
                continue;
            }
            i3 = (c >> UCPTRIE_SHIFT_3) & UCPTRIE_INDEX_3_MASK;
            i3BlockLength = UCPTRIE_INDEX_3_BLOCK_LENGTH;
            dataBlockLength = UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
        }
        // Enumerate data blocks for one index-3 block.
        do {
            int32_t block;
            if ((i3Block & 0x8000) == 0) {
                block = index[i3Block + i3];
            } else {
                // 18-bit indexes stored in groups of 9 entries per 8 indexes.
                int32_t group = (i3Block & 0x7fff) + (i3 & ~7) + (i3 >> 3);
                int32_t gi = i3 & 7;
                block = ((int32_t)index[group++] << (2 + (2 * gi))) & 0x30000;
                block |= index[group + gi];
            }
            if (block == prevBlock && (c - start) >= dataBlockLength) {
                // The block is the same as the previous one, and filled with value.
                U_ASSERT((c & (dataBlockLength - 1)) == 0);
                c += dataBlockLength;
            } else {
                int32_t dataMask = dataBlockLength - 1;
                prevBlock = block;
                if (block == trie->dataNullOffset) {
                    // This is the data null block.
                    if (haveValue) {
                        if (nullValue != value) {
                            return c - 1;
                        }
                    } else {
                        value = nullValue;
                        if (pValue != nullptr) { *pValue = nullValue; }
                        haveValue = true;
                    }
                    c = (c + dataBlockLength) & ~dataMask;
                } else {
                    int32_t di = block + (c & dataMask);
                    uint32_t value2 = getValue(trie->data, valueWidth, di);
                    value2 = maybeFilterValue(value2, trie->nullValue, nullValue,
                                              filter, context);
                    if (haveValue) {
                        if (value2 != value) {
                            return c - 1;
                        }
                    } else {
                        value = value2;
                        if (pValue != nullptr) { *pValue = value; }
                        haveValue = true;
                    }
                    while ((++c & dataMask) != 0) {
                        if (maybeFilterValue(getValue(trie->data, valueWidth, ++di),
                                             trie->nullValue, nullValue,
                                             filter, context) != value) {
                            return c - 1;
                        }
                    }
                }
            }
        } while (++i3 < i3BlockLength);
    } while (c < trie->highStart);
    U_ASSERT(haveValue);
    int32_t di = trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET;
    uint32_t highValue = getValue(trie->data, valueWidth, di);
    if (maybeFilterValue(highValue, trie->nullValue, nullValue,
                         filter, context) != value) {
        return c - 1;
    } else {
        return MAX_UNICODE;
    }
}